

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

SLabelTableEntry *
SearchLabel(char **p,bool setUsed,unique_ptr<char[],_std::default_delete<char[]>_> *fullName)

{
  char cVar1;
  char cVar2;
  aint *paVar3;
  bool bVar4;
  int iVar5;
  char *__p;
  size_t sVar6;
  SLabelTableEntry *pSVar7;
  pointer pcVar8;
  bool local_51;
  SLabelTableEntry *labelEntry;
  SLabelTableEntry *undefinedLabelEntry;
  char *findName;
  int modNameLen;
  bool inMacro;
  bool local;
  bool global;
  unique_ptr<char[],_std::default_delete<char[]>_> *fullName_local;
  bool setUsed_local;
  char **p_local;
  
  getLabel_invalidName = true;
  __p = ValidateLabel(*p,false,true);
  std::unique_ptr<char[],std::default_delete<char[]>>::reset<char*,void>
            ((unique_ptr<char[],std::default_delete<char[]>> *)fullName,__p);
  bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)fullName);
  if (bVar4) {
    getLabel_invalidName = false;
    cVar1 = **p;
    cVar2 = **p;
    while (iVar5 = islabchar(**p), iVar5 != 0) {
      *p = *p + 1;
    }
    local_51 = cVar2 == '.' && macrolabp != (char *)0x0;
    sVar6 = strlen(ModuleName);
    iVar5 = (int)sVar6;
    undefinedLabelEntry =
         (SLabelTableEntry *)std::unique_ptr<char[],_std::default_delete<char[]>_>::get(fullName);
    labelEntry = (SLabelTableEntry *)0x0;
    temp[0] = '\0';
    do {
      pSVar7 = CLabelTable::Find(&LabelTable,(char *)undefinedLabelEntry,false);
      if (pSVar7 != (SLabelTableEntry *)0x0) {
        if ((setUsed) && (pass < 3)) {
          pSVar7->used = true;
        }
        labelEntry = pSVar7;
        if (pSVar7->page != -1) {
          return pSVar7;
        }
      }
      if (local_51) {
        while( true ) {
          bVar4 = false;
          if ((char)undefinedLabelEntry->value != '>') {
            bVar4 = (char)undefinedLabelEntry->value != '.';
          }
          if (!bVar4) break;
          undefinedLabelEntry = (SLabelTableEntry *)((long)&undefinedLabelEntry->value + 1);
        }
        pSVar7 = (SLabelTableEntry *)((long)&undefinedLabelEntry->value + 1);
        paVar3 = &undefinedLabelEntry->value;
        undefinedLabelEntry = pSVar7;
        if ((char)*paVar3 == '>') {
          local_51 = false;
          if (iVar5 != 0) {
            strncat(temp,ModuleName,0x7fe);
            strncat(temp,".",2);
          }
          strncat(temp,vorlabp,0x3f);
          strncat(temp,".",2);
          strncat(temp,(char *)pSVar7,0x3f);
          undefinedLabelEntry = (SLabelTableEntry *)temp;
        }
      }
      else if ((((cVar1 == '@') || (cVar2 == '.')) ||
               (pSVar7 = (SLabelTableEntry *)
                         std::unique_ptr<char[],_std::default_delete<char[]>_>::get(fullName),
               pSVar7 != undefinedLabelEntry)) || (iVar5 == 0)) {
        undefinedLabelEntry = (SLabelTableEntry *)0x0;
      }
      else {
        pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(fullName);
        undefinedLabelEntry = (SLabelTableEntry *)(pcVar8 + (long)iVar5 + 1);
      }
    } while (undefinedLabelEntry != (SLabelTableEntry *)0x0);
    p_local = (char **)labelEntry;
  }
  else {
    p_local = (char **)0x0;
  }
  return (SLabelTableEntry *)p_local;
}

Assistant:

static SLabelTableEntry* SearchLabel(char*& p, bool setUsed, /*out*/ std::unique_ptr<char[]>& fullName) {
	getLabel_invalidName = true;
	fullName.reset(ValidateLabel(p, false, true));
	if (!fullName) return nullptr;
	getLabel_invalidName = false;
	const bool global = '@' == *p;
	const bool local = '.' == *p;
	while (islabchar(*p)) ++p;		// advance pointer beyond the parsed label
	// find the label entry in the label table (for local macro labels it has to try all sub-parts!)
	// then regular full label has to be tried
	// and if it's regular non-local in module, then variant w/o current module has to be tried
	bool inMacro = local && macrolabp;		// not just inside macro, but should be prefixed
	const int modNameLen = strlen(ModuleName);
	const char *findName = fullName.get();
	SLabelTableEntry* undefinedLabelEntry = nullptr;
	SLabelTableEntry* labelEntry = nullptr;
	temp[0] = 0;
	do {
		labelEntry = LabelTable.Find(findName);
		if (labelEntry) {
			if (setUsed && pass < LASTPASS) labelEntry->used = true;
			if (LABEL_PAGE_UNDEFINED != labelEntry->page) return labelEntry;	// found
			// if found, but "undefined" one, remember it as fall-back result
			undefinedLabelEntry = labelEntry;
			labelEntry = nullptr;
		}
		// not found (the defined one, try more variants)
		if (inMacro) {				// try outer macro (if there is one)
			while ('>' != *findName && '.' != *findName) ++findName;
			// if no more outer macros, try module+non-local prefix with the original local label
			if ('>' == *findName++) {
				inMacro = false;
				if (modNameLen) {
					#pragma GCC diagnostic push	// disable gcc8 warning about truncation - that's intended behaviour
					#if 8 <= __GNUC__
						#pragma GCC diagnostic ignored "-Wstringop-truncation"
					#endif
					STRCAT(temp, LINEMAX-2, ModuleName); STRCAT(temp, 2, ".");
					#pragma GCC diagnostic pop
				}
				STRCAT(temp, LABMAX-1, vorlabp); STRCAT(temp, 2, ".");
				STRCAT(temp, LABMAX-1, findName);
				findName = temp;
			}
		} else {
			if (!global && !local && fullName.get() == findName && modNameLen) {
				// this still may be global label without current module (but author didn't use "@")
				findName = fullName.get() + modNameLen + 1;
			} else {
				findName = nullptr;	// all options exhausted
			}
		}
	} while (findName);
	return undefinedLabelEntry;
}